

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O0

void server::aiman::calcteams(vector<teamscore> *teams)

{
  vector<teamscore> *pvVar1;
  int iVar2;
  int iVar3;
  clientinfo **ppcVar4;
  teamscore *ptVar5;
  teamscore local_58;
  int local_44;
  undefined1 local_40 [4];
  int i_1;
  int local_2c;
  teamscore *ptStack_28;
  int j;
  teamscore *t;
  clientinfo *ci;
  vector<teamscore> *pvStack_10;
  int i;
  vector<teamscore> *teams_local;
  
  ci._4_4_ = 0;
  pvStack_10 = teams;
  do {
    iVar3 = ci._4_4_;
    iVar2 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients);
    if (iVar2 <= iVar3) {
      vector<teamscore>::sort<bool(*)(teamscore_const&,teamscore_const&)>
                (pvStack_10,teamscore::compare,0,-1);
      iVar3 = vector<teamscore>::length(pvStack_10);
      if (iVar3 < 2) {
        for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
          iVar3 = vector<teamscore>::htfind<char_const*>(pvStack_10,calcteams::defaults + local_44);
          pvVar1 = pvStack_10;
          if (iVar3 < 0) {
            teamscore::teamscore(&local_58,calcteams::defaults[local_44],0);
            vector<teamscore>::add(pvVar1,&local_58);
          }
        }
      }
      return;
    }
    ppcVar4 = vector<server::clientinfo_*>::operator[]
                        ((vector<server::clientinfo_*> *)clients,ci._4_4_);
    t = (teamscore *)*ppcVar4;
    if (((((clientinfo *)t)->state).state != 5) && (((clientinfo *)t)->team[0] != '\0')) {
      ptStack_28 = (teamscore *)0x0;
      for (local_2c = 0; iVar3 = local_2c, iVar2 = vector<teamscore>::length(pvStack_10),
          iVar3 < iVar2; local_2c = local_2c + 1) {
        ptVar5 = vector<teamscore>::operator[](pvStack_10,local_2c);
        iVar3 = strcmp(ptVar5->team,(char *)((long)&t[0x12].team + 4));
        if (iVar3 == 0) {
          ptStack_28 = vector<teamscore>::operator[](pvStack_10,local_2c);
          break;
        }
      }
      pvVar1 = pvStack_10;
      if (ptStack_28 == (teamscore *)0x0) {
        teamscore::teamscore((teamscore *)local_40,(char *)((long)&t[0x12].team + 4),1);
        vector<teamscore>::add(pvVar1,(teamscore *)local_40);
      }
      else {
        ptStack_28->score = ptStack_28->score + 1;
      }
    }
    ci._4_4_ = ci._4_4_ + 1;
  } while( true );
}

Assistant:

void calcteams(vector<teamscore> &teams)
    {
        static const char * const defaults[2] = { "good", "evil" };
        loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(ci->state.state==CS_SPECTATOR || !ci->team[0]) continue;
            teamscore *t = NULL;
            loopvj(teams) if(!strcmp(teams[j].team, ci->team)) { t = &teams[j]; break; }
            if(t) t->score++;
            else teams.add(teamscore(ci->team, 1));
        }
        teams.sort(teamscore::compare);
        if(teams.length() < int(sizeof(defaults)/sizeof(defaults[0])))
        {
            loopi(sizeof(defaults)/sizeof(defaults[0])) if(teams.htfind(defaults[i]) < 0) teams.add(teamscore(defaults[i], 0));
        }
    }